

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O1

int pattern_search(FULLPEL_MV start_mv,FULLPEL_MOTION_SEARCH_PARAMS *ms_params,int search_step,
                  int do_init_search,int *cost_list,FULLPEL_MV *best_mv,
                  FULLPEL_MV_STATS *best_mv_stats)

{
  byte bVar1;
  MV_COST_TYPE MVar2;
  buf_2d *pbVar3;
  uint *puVar4;
  MV_COST_PARAMS *pMVar5;
  FULLPEL_MV FVar6;
  int iVar7;
  long lVar8;
  bool bVar9;
  char cVar10;
  short sVar11;
  ushort uVar12;
  buf_2d *pbVar13;
  short sVar14;
  ushort uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  FULLPEL_MOTION_SEARCH_PARAMS *pFVar20;
  int i;
  uint uVar21;
  ushort uVar22;
  uint uVar23;
  int iVar24;
  uint8_t *puVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  int iVar32;
  int iVar33;
  ulong uVar34;
  ulong uVar35;
  uint *puVar36;
  int best_site_1;
  uint raw_bestsad;
  uint bestsad;
  search_site_config *local_b0;
  uint8_t *local_a8;
  FULLPEL_MV *local_a0;
  ulong local_98;
  uint *local_90;
  MV_COST_PARAMS *local_88;
  int best_site;
  int local_78;
  int local_74;
  buf_2d *local_70;
  FULLPEL_MOTION_SEARCH_PARAMS *local_68;
  int local_60;
  uint local_5c;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  int local_34;
  ulong uVar19;
  
  pbVar13 = (ms_params->ms_buffers).ref;
  pbVar3 = (ms_params->ms_buffers).src;
  local_b0 = ms_params->search_sites;
  iVar7 = pbVar13->stride;
  local_34 = local_b0->searches_per_step[0];
  bestsad = 0xffffffff;
  raw_bestsad = 0xffffffff;
  iVar18 = 10;
  if (search_step < 10) {
    iVar18 = search_step;
  }
  uVar23 = (uint)start_mv.row;
  iVar24 = (int)start_mv >> 0x10;
  iVar33 = (ms_params->mv_limits).col_min;
  iVar32 = (ms_params->mv_limits).col_max;
  if (iVar24 < iVar32) {
    iVar32 = iVar24;
  }
  if (iVar24 < iVar33) {
    iVar32 = iVar33;
  }
  uVar17 = (ms_params->mv_limits).row_min;
  uVar21 = (ms_params->mv_limits).row_max;
  if ((int)uVar23 < (int)uVar21) {
    uVar21 = uVar23;
  }
  if ((int)uVar23 < (int)uVar17) {
    uVar21 = uVar17;
  }
  uVar23 = pattern_search::search_steps[iVar18];
  uVar17 = (uint)(short)uVar21;
  uVar19 = (ulong)uVar17;
  sVar11 = (short)iVar32;
  local_98 = (ulong)(uint)(int)sVar11;
  if (cost_list != (int *)0x0) {
    cost_list[4] = 0x7fffffff;
    cost_list[0] = 0x7fffffff;
    cost_list[1] = 0x7fffffff;
    cost_list[2] = 0x7fffffff;
    cost_list[3] = 0x7fffffff;
  }
  puVar36 = (uint *)0x1e4311;
  local_a0 = best_mv;
  local_90 = (uint *)cost_list;
  local_60 = do_init_search;
  raw_bestsad = (*ms_params->sdf)(pbVar3->buf,pbVar3->stride,
                                  pbVar13->buf + (int)(pbVar13->stride * uVar17 + (int)sVar11),iVar7
                                 );
  bVar1 = (ms_params->mv_cost_params).mv_cost_type;
  if (bVar1 < 4) {
    sVar14 = (short)uVar21 - (ms_params->mv_cost_params).full_ref_mv.row;
    uVar15 = sVar14 * 8;
    sVar11 = sVar11 - (ms_params->mv_cost_params).full_ref_mv.col;
    uVar12 = sVar11 * 8;
    switch(bVar1) {
    case 0:
      uVar16 = ((ms_params->mv_cost_params).mvcost[0][(short)uVar15] +
                *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                        (ulong)((uint)(uVar12 != 0) * 4 + (uint)(uVar15 != 0) * 8)) +
               (ms_params->mv_cost_params).mvcost[1][(short)uVar12]) *
               (ms_params->mv_cost_params).sad_per_bit + 0x100U >> 9;
      break;
    case 1:
      uVar22 = sVar14 * -8;
      if ((short)(sVar14 * -8) < 0) {
        uVar22 = uVar15;
      }
      uVar15 = sVar11 * -8;
      if ((short)(sVar11 * -8) < 0) {
        uVar15 = uVar12;
      }
      uVar16 = ((uint)uVar15 + (uint)uVar22) * 4;
      break;
    case 2:
      uVar22 = sVar14 * -8;
      if ((short)(sVar14 * -8) < 0) {
        uVar22 = uVar15;
      }
      uVar15 = sVar11 * -8;
      if ((short)(sVar11 * -8) < 0) {
        uVar15 = uVar12;
      }
      uVar16 = ((uint)uVar15 + (uint)uVar22) * 0xf >> 3;
      break;
    case 3:
      uVar22 = sVar14 * -8;
      if ((short)(sVar14 * -8) < 0) {
        uVar22 = uVar15;
      }
      uVar15 = sVar11 * -8;
      if ((short)(sVar11 * -8) < 0) {
        uVar15 = uVar12;
      }
      uVar16 = (uint)uVar15 + (uint)uVar22;
    }
  }
  else {
    uVar16 = 0;
  }
  local_88 = &ms_params->mv_cost_params;
  bestsad = uVar16 + raw_bestsad;
  puVar25 = pbVar13->buf + (int)(pbVar13->stride * uVar17 + (int)local_98);
  if (local_60 == 0) {
    pbVar13 = (buf_2d *)0xffffffff;
    uVar34 = local_98;
  }
  else {
    FVar6 = (FULLPEL_MV)(uVar21 & 0xffff | iVar32 << 0x10);
    local_50 = CONCAT44(local_50._4_4_,FVar6);
    uVar34 = 0;
    if ((int)uVar23 < 1) {
      uVar23 = 0;
    }
    local_48 = (ulong)(uVar23 + 1);
    local_70 = (buf_2d *)0xffffffff;
    uVar23 = 0xffffffff;
    local_a8 = puVar25;
    local_58 = uVar19;
    do {
      pMVar5 = local_88;
      best_site = -1;
      iVar7 = 1 << ((byte)uVar34 & 0x1f);
      uVar17 = local_b0->searches_per_step[uVar34];
      uVar21 = (uint)uVar34;
      if (((((int)uVar19 - iVar7 < (ms_params->mv_limits).row_min) ||
           ((ms_params->mv_limits).row_max < iVar7 + (int)uVar19)) ||
          ((int)local_98 - iVar7 < (ms_params->mv_limits).col_min)) ||
         ((ms_params->mv_limits).col_max < iVar7 + (int)local_98)) {
        puVar36 = (uint *)0x0;
        calc_sad_update_bestmv
                  (ms_params,local_88,local_a0,local_50._0_4_,local_a8,&bestsad,&raw_bestsad,uVar21,
                   &best_site,uVar17,0,(int *)0x0);
      }
      else {
        iVar7 = (int)uVar17 >> 2;
        local_5c = uVar23;
        local_40 = (ulong)uVar17;
        if (0 < iVar7) {
          iVar18 = 0;
          do {
            calc_sad4_update_bestmv
                      (ms_params,pMVar5,local_a0,FVar6,local_a8,&bestsad,&raw_bestsad,uVar21,
                       &best_site,iVar18,(int *)0x0);
            iVar18 = iVar18 + 4;
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
        }
        puVar36 = (uint *)0x0;
        calc_sad_update_bestmv
                  (ms_params,pMVar5,local_a0,FVar6,local_a8,&bestsad,&raw_bestsad,uVar21,&best_site,
                   local_b0->searches_per_step[uVar34] % 4,(uint)local_40 & 0xfffffffc,(int *)0x0);
        uVar19 = local_58;
        uVar23 = local_5c;
      }
      if (best_site != -1) {
        uVar23 = uVar21;
      }
      pbVar13 = (buf_2d *)((ulong)local_70 & 0xffffffff);
      if (best_site != -1) {
        pbVar13 = (buf_2d *)(ulong)(uint)best_site;
      }
      uVar34 = uVar34 + 1;
      local_70 = pbVar13;
    } while (uVar34 != local_48);
    if (uVar23 == 0xffffffff) {
      uVar23 = 0xffffffff;
      uVar34 = local_98;
      puVar25 = local_a8;
    }
    else {
      iVar7 = (int)pbVar13;
      uVar19 = (ulong)(uint)((int)uVar19 + (int)local_b0->site[(int)uVar23][iVar7].mv.row);
      uVar34 = (ulong)(uint)((int)local_98 + (int)local_b0->site[(int)uVar23][iVar7].mv.col);
      puVar25 = local_a8 + local_b0->site[(int)uVar23][iVar7].offset;
    }
  }
  local_68 = ms_params;
  if (uVar23 == 0xffffffff) {
    cVar10 = '\x01';
  }
  else {
    bVar9 = local_34 == 4 && local_90 != (uint *)0x0;
    best_site_1 = -1;
    uVar17 = uVar23;
    if ((int)(uint)bVar9 <= (int)uVar23) {
      uVar35 = (ulong)uVar23;
      local_48 = CONCAT44(local_48._4_4_,(uint)bVar9);
      local_5c = uVar23;
      local_50 = uVar35;
      do {
        pMVar5 = local_88;
        iVar7 = (int)uVar35;
        if ((local_60 == 0) || (uVar35 != local_50)) {
          iVar18 = 1 << ((byte)uVar35 & 0x1f);
          uVar17 = (uint)uVar19;
          uVar23 = local_b0->searches_per_step[uVar35];
          iVar33 = (int)uVar34;
          local_a8 = puVar25;
          local_98 = uVar34;
          if ((((int)(uVar17 - iVar18) < (ms_params->mv_limits).row_min) ||
              (((ms_params->mv_limits).row_max < (int)(iVar18 + uVar17) ||
               (iVar33 - iVar18 < (ms_params->mv_limits).col_min)))) ||
             ((ms_params->mv_limits).col_max < iVar18 + iVar33)) {
            FVar6 = (FULLPEL_MV)(uVar17 & 0xffff | iVar33 << 0x10);
            uVar17 = 0;
          }
          else {
            iVar18 = (int)uVar23 >> 2;
            local_58 = uVar19;
            local_40 = (ulong)uVar23;
            if (0 < iVar18) {
              local_58._0_2_ = (ushort)uVar19;
              local_70 = (buf_2d *)CONCAT44(local_70._4_4_,(uint)(ushort)local_58 | iVar33 << 0x10);
              iVar33 = 0;
              do {
                calc_sad4_update_bestmv
                          (ms_params,pMVar5,local_a0,local_70._0_4_,local_a8,&bestsad,&raw_bestsad,
                           iVar7,&best_site_1,iVar33,(int *)0x0);
                iVar33 = iVar33 + 4;
                iVar18 = iVar18 + -1;
              } while (iVar18 != 0);
            }
            uVar23 = local_b0->searches_per_step[uVar35] % 4;
            uVar17 = (uint)local_40 & 0xfffffffc;
            FVar6 = (FULLPEL_MV)((uint)local_58 & 0xffff | (int)local_98 << 0x10);
            uVar19 = local_58;
          }
          puVar36 = (uint *)0x0;
          calc_sad_update_bestmv
                    (ms_params,pMVar5,local_a0,FVar6,local_a8,&bestsad,&raw_bestsad,iVar7,
                     &best_site_1,uVar23,uVar17,(int *)0x0);
          lVar8 = (long)best_site_1;
          uVar34 = local_98;
          puVar25 = local_a8;
          if (lVar8 != -1) {
            uVar19 = (ulong)(uint)((int)uVar19 + (int)local_b0->site[uVar35][lVar8].mv.row);
            pbVar13 = (buf_2d *)(ulong)(uint)best_site_1;
            uVar34 = (ulong)(uint)((int)local_98 + (int)local_b0->site[uVar35][lVar8].mv.col);
            puVar25 = local_a8 + local_b0->site[uVar35][lVar8].offset;
          }
          if (best_site_1 != -1) goto LAB_001e48a1;
        }
        else {
LAB_001e48a1:
          iVar18 = 1 << ((byte)uVar35 & 0x1f);
          do {
            best_site_1 = -1;
            local_78 = (int)pbVar13;
            iVar33 = local_78;
            if (local_78 == 0) {
              iVar33 = local_b0->searches_per_step[uVar35];
            }
            best_site = iVar33 + -1;
            local_74 = local_78 + 1;
            if (local_78 == local_b0->searches_per_step[uVar35] + -1) {
              local_74 = 0;
            }
            uVar23 = (uint)uVar19;
            iVar33 = (int)uVar34;
            FVar6 = (FULLPEL_MV)(uVar23 & 0xffff | iVar33 << 0x10);
            if (((((int)(uVar23 - iVar18) < (ms_params->mv_limits).row_min) ||
                 ((ms_params->mv_limits).row_max < (int)(uVar23 + iVar18))) ||
                (iVar33 - iVar18 < (ms_params->mv_limits).col_min)) ||
               ((ms_params->mv_limits).col_max < iVar33 + iVar18)) {
              calc_sad_update_bestmv_with_indices
                        (ms_params,local_88,local_a0,FVar6,puVar25,&bestsad,&raw_bestsad,iVar7,
                         &best_site_1,(int)&best_site,(int *)0x0,(int *)puVar36);
            }
            else {
              calc_sad3_update_bestmv
                        (ms_params,local_88,local_a0,FVar6,puVar25,&bestsad,&raw_bestsad,iVar7,
                         &best_site_1,&best_site,(int *)0x0);
            }
            if ((long)best_site_1 != -1) {
              pbVar13 = (buf_2d *)(long)(&best_site)[best_site_1];
              uVar19 = (ulong)(uVar23 + (int)local_b0->site[uVar35][(long)pbVar13].mv.row);
              uVar34 = (ulong)(uint)(iVar33 + local_b0->site[uVar35][(long)pbVar13].mv.col);
              puVar25 = puVar25 + local_b0->site[uVar35][(long)pbVar13].offset;
            }
            ms_params = local_68;
          } while (best_site_1 != -1);
        }
        uVar35 = uVar35 - 1;
      } while ((int)local_48 < iVar7);
      uVar23 = local_5c;
      uVar17 = (int)local_48 - 1;
    }
    local_a8 = (uint8_t *)CONCAT71(local_a8._1_7_,uVar17 != 0);
    if (uVar17 == 0) {
      *local_90 = raw_bestsad;
      if ((local_60 == 0) || (uVar23 != 0)) {
        iVar7 = (int)uVar34;
        uVar23 = (uint)uVar19;
        FVar6 = (FULLPEL_MV)(uVar23 & 0xffff | iVar7 << 0x10);
        if ((((ms_params->mv_limits).row_min < (int)uVar23) &&
            (((int)uVar23 < (ms_params->mv_limits).row_max &&
             ((ms_params->mv_limits).col_min < iVar7)))) && (iVar7 < (ms_params->mv_limits).col_max)
           ) {
          calc_sad4_update_bestmv
                    (ms_params,local_88,local_a0,FVar6,puVar25,&bestsad,&raw_bestsad,0,&best_site_1,
                     0,(int *)local_90);
        }
        else {
          puVar36 = local_90;
          calc_sad_update_bestmv
                    (ms_params,local_88,local_a0,FVar6,puVar25,&bestsad,&raw_bestsad,0,&best_site_1,
                     4,0,(int *)local_90);
        }
        lVar8 = (long)best_site_1;
        if (lVar8 != -1) {
          uVar19 = (ulong)(uVar23 + (int)local_b0->site[0][lVar8].mv.row);
          uVar34 = (ulong)(uint)(iVar7 + local_b0->site[0][lVar8].mv.col);
          puVar25 = puVar25 + local_b0->site[0][lVar8].offset;
          pbVar13 = (buf_2d *)(ulong)(uint)best_site_1;
        }
      }
      if (best_site_1 != -1) {
        do {
          best_site_1 = -1;
          local_78 = (int)pbVar13;
          iVar7 = local_78;
          if (local_78 == 0) {
            iVar7 = local_b0->searches_per_step[0];
          }
          best_site = iVar7 + -1;
          local_74 = local_78 + 1;
          if (local_78 == local_b0->searches_per_step[0] + -1) {
            local_74 = 0;
          }
          local_90[1] = 0x7fffffff;
          local_90[2] = 0x7fffffff;
          local_90[3] = 0x7fffffff;
          local_90[4] = 0x7fffffff;
          uVar23 = local_78 + 5;
          if (-1 < (int)(local_78 + 2U)) {
            uVar23 = local_78 + 2U;
          }
          local_90[(long)(int)((local_78 - (uVar23 & 0xfffffffc)) + 2) + 1] = *local_90;
          *local_90 = raw_bestsad;
          iVar7 = (int)uVar34;
          uVar23 = (uint)uVar19;
          FVar6 = (FULLPEL_MV)(uVar23 & 0xffff | iVar7 << 0x10);
          if (((((ms_params->mv_limits).row_min < (int)uVar23) &&
               ((int)uVar23 < (ms_params->mv_limits).row_max)) &&
              ((ms_params->mv_limits).col_min < iVar7)) && (iVar7 < (ms_params->mv_limits).col_max))
          {
            calc_sad3_update_bestmv
                      (ms_params,local_88,local_a0,FVar6,puVar25,&bestsad,&raw_bestsad,0,
                       &best_site_1,&best_site,(int *)local_90);
          }
          else {
            calc_sad_update_bestmv_with_indices
                      (ms_params,local_88,local_a0,FVar6,puVar25,&bestsad,&raw_bestsad,0,
                       &best_site_1,(int)&best_site,(int *)local_90,(int *)puVar36);
          }
          if ((long)best_site_1 != -1) {
            pbVar13 = (buf_2d *)(long)(&best_site)[best_site_1];
            uVar19 = (ulong)(uVar23 + (int)local_b0->site[0][(long)pbVar13].mv.row);
            uVar34 = (ulong)(uint)(iVar7 + local_b0->site[0][(long)pbVar13].mv.col);
            puVar25 = puVar25 + local_b0->site[0][(long)pbVar13].offset;
          }
          ms_params = local_68;
        } while (best_site_1 != -1);
      }
    }
    cVar10 = (char)local_a8;
  }
  pFVar20 = local_68;
  puVar36 = local_90;
  local_a0->row = (int16_t)uVar19;
  local_a0->col = (int16_t)uVar34;
  if (local_90 != (uint *)0x0) {
    FVar6 = *local_a0;
    local_b0 = (search_site_config *)CONCAT44(local_b0._4_4_,FVar6);
    local_a8 = (uint8_t *)CONCAT44(local_a8._4_4_,(uint)FVar6 >> 0x10);
    if (cVar10 != '\0') {
      local_70 = (local_68->ms_buffers).ref;
      pbVar13 = (local_68->ms_buffers).src;
      iVar7 = local_70->stride;
      iVar33 = (int)FVar6 >> 0x10;
      iVar18 = (int)FVar6.row;
      local_98 = CONCAT44(local_98._4_4_,iVar7);
      uVar23 = (*local_68->sdf)(pbVar13->buf,pbVar13->stride,
                                local_70->buf + (iVar7 * iVar18 + iVar33),iVar7);
      puVar4 = local_90;
      puVar25 = local_a8;
      *puVar36 = uVar23;
      if ((((pFVar20->mv_limits).row_min < iVar18) && (iVar18 < (pFVar20->mv_limits).row_max)) &&
         (((pFVar20->mv_limits).col_min < iVar33 && (iVar33 < (pFVar20->mv_limits).col_max)))) {
        lVar8 = 0;
        do {
          uVar23 = (*pFVar20->sdf)(pbVar13->buf,pbVar13->stride,
                                   local_70->buf +
                                   ((int)(short)((&DAT_004eca82)[lVar8 * 2] + (short)puVar25) +
                                   (int)(short)((&calc_int_sad_list_neighbors)[lVar8 * 2] +
                                               (short)local_b0) * local_70->stride),(int)local_98);
          puVar4[lVar8 + 1] = uVar23;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
      }
      else {
        lVar8 = 0;
        do {
          iVar7 = (int)(short)((&DAT_004eca82)[lVar8 * 2] + (short)local_a8._0_4_);
          uVar23 = 0x7fffffff;
          if (((pFVar20->mv_limits).col_min <= iVar7) && (iVar7 <= (pFVar20->mv_limits).col_max)) {
            iVar18 = (int)(short)((&calc_int_sad_list_neighbors)[lVar8 * 2] + (short)local_b0);
            if (((pFVar20->mv_limits).row_min <= iVar18) && (iVar18 <= (pFVar20->mv_limits).row_max)
               ) {
              uVar23 = (*local_68->sdf)(pbVar13->buf,pbVar13->stride,
                                        local_70->buf + (iVar18 * local_70->stride + iVar7),
                                        (int)local_98);
            }
          }
          local_90[lVar8 + 1] = uVar23;
          lVar8 = lVar8 + 1;
          pFVar20 = local_68;
        } while (lVar8 != 4);
      }
    }
    bVar1 = (pFVar20->mv_cost_params).mv_cost_type;
    sVar11 = (pFVar20->mv_cost_params).full_ref_mv.row;
    sVar14 = (pFVar20->mv_cost_params).full_ref_mv.col;
    if (bVar1 < 4) {
      sVar27 = (short)local_b0 - sVar11;
      uVar15 = sVar27 * 8;
      sVar26 = (short)local_a8 - sVar14;
      uVar12 = sVar26 * 8;
      switch(bVar1) {
      case 0:
        uVar23 = ((local_68->mv_cost_params).mvcost[0][(short)uVar15] +
                  *(int *)((long)(local_68->mv_cost_params).mvjcost +
                          (ulong)((uint)(uVar12 != 0) * 4 + (uint)(uVar15 != 0) * 8)) +
                 (local_68->mv_cost_params).mvcost[1][(short)uVar12]) *
                 (local_68->mv_cost_params).sad_per_bit + 0x100U >> 9;
        break;
      case 1:
        uVar22 = sVar27 * -8;
        if ((short)(sVar27 * -8) < 0) {
          uVar22 = uVar15;
        }
        uVar15 = sVar26 * -8;
        if ((short)(sVar26 * -8) < 0) {
          uVar15 = uVar12;
        }
        uVar23 = ((uint)uVar15 + (uint)uVar22) * 4;
        break;
      case 2:
        uVar22 = sVar27 * -8;
        if ((short)(sVar27 * -8) < 0) {
          uVar22 = uVar15;
        }
        uVar15 = sVar26 * -8;
        if ((short)(sVar26 * -8) < 0) {
          uVar15 = uVar12;
        }
        uVar23 = ((uint)uVar15 + (uint)uVar22) * 0xf >> 3;
        break;
      case 3:
        uVar22 = sVar27 * -8;
        if ((short)(sVar27 * -8) < 0) {
          uVar22 = uVar15;
        }
        uVar15 = sVar26 * -8;
        if ((short)(sVar26 * -8) < 0) {
          uVar15 = uVar12;
        }
        uVar23 = (uint)uVar15 + (uint)uVar22;
      }
    }
    else {
      uVar23 = 0;
    }
    *local_90 = *local_90 + uVar23;
    lVar8 = 0;
    do {
      if (local_90[lVar8 + 1] != 0x7fffffff) {
        if (bVar1 < 4) {
          sVar27 = (&calc_int_sad_list_neighbors)[lVar8 * 2] + ((short)local_b0 - sVar11);
          uVar15 = sVar27 * 8;
          sVar26 = (&DAT_004eca82)[lVar8 * 2] + ((short)local_a8 - sVar14);
          uVar12 = sVar26 * 8;
          switch(bVar1) {
          case 0:
            uVar23 = ((local_68->mv_cost_params).mvcost[0][(short)uVar15] +
                      *(int *)((long)(local_68->mv_cost_params).mvjcost +
                              (ulong)((uint)(uVar12 != 0) * 4 + (uint)(uVar15 != 0) * 8)) +
                     (local_68->mv_cost_params).mvcost[1][(short)uVar12]) *
                     (local_68->mv_cost_params).sad_per_bit + 0x100U >> 9;
            break;
          case 1:
            uVar22 = sVar27 * -8;
            if ((short)(sVar27 * -8) < 0) {
              uVar22 = uVar15;
            }
            uVar15 = sVar26 * -8;
            if ((short)(sVar26 * -8) < 0) {
              uVar15 = uVar12;
            }
            uVar23 = ((uint)uVar15 + (uint)uVar22) * 4;
            break;
          case 2:
            uVar22 = sVar27 * -8;
            if ((short)(sVar27 * -8) < 0) {
              uVar22 = uVar15;
            }
            uVar15 = sVar26 * -8;
            if ((short)(sVar26 * -8) < 0) {
              uVar15 = uVar12;
            }
            uVar23 = ((uint)uVar15 + (uint)uVar22) * 0xf >> 3;
            break;
          case 3:
            uVar22 = sVar27 * -8;
            if ((short)(sVar27 * -8) < 0) {
              uVar22 = uVar15;
            }
            uVar15 = sVar26 * -8;
            if ((short)(sVar26 * -8) < 0) {
              uVar15 = uVar12;
            }
            uVar23 = (uint)uVar15 + (uint)uVar22;
          }
        }
        else {
          uVar23 = 0;
        }
        local_90[lVar8 + 1] = uVar23 + local_90[lVar8 + 1];
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
  }
  pFVar20 = local_68;
  sVar11 = local_a0->row;
  sVar14 = local_a0->col;
  pbVar13 = (local_68->ms_buffers).src;
  pbVar3 = (local_68->ms_buffers).ref;
  iVar7 = pbVar3->stride;
  uVar23 = (*local_68->vfp->vf)
                     (pbVar13->buf,pbVar13->stride,pbVar3->buf + (iVar7 * sVar11 + (int)sVar14),
                      iVar7,&best_mv_stats->sse);
  best_mv_stats->distortion = uVar23;
  MVar2 = (pFVar20->mv_cost_params).mv_cost_type;
  iVar7 = 0;
  if (MVar2 != '\x04') {
    sVar26 = local_88->ref_mv->row;
    sVar27 = (short)((int)sVar11 << 3);
    sVar28 = sVar27 - sVar26;
    sVar11 = local_88->ref_mv->col;
    sVar14 = (short)((int)sVar14 << 3);
    sVar30 = sVar14 - sVar11;
    sVar29 = -sVar28;
    if (0 < sVar28) {
      sVar29 = sVar28;
    }
    sVar31 = -sVar30;
    if (0 < sVar30) {
      sVar31 = sVar30;
    }
    if (MVar2 == '\x03') {
      iVar7 = (int)sVar31 + (int)sVar29 >> 3;
    }
    else if (MVar2 == '\x01') {
      iVar7 = (int)sVar31 + (int)sVar29 >> 2;
    }
    else if (MVar2 == '\0') {
      iVar7 = (int)(((long)(pFVar20->mv_cost_params).mvcost[1][sVar30] +
                     (long)(pFVar20->mv_cost_params).mvcost[0][sVar28] +
                    (long)*(int *)((long)(pFVar20->mv_cost_params).mvjcost +
                                  (ulong)((uint)(sVar14 != sVar11) * 4 +
                                         (uint)(sVar27 != sVar26) * 8))) *
                    (long)(pFVar20->mv_cost_params).error_per_bit + 0x2000U >> 0xe);
    }
  }
  best_mv_stats->err_cost = iVar7;
  return uVar23 + iVar7;
}

Assistant:

static int pattern_search(FULLPEL_MV start_mv,
                          const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
                          int search_step, const int do_init_search,
                          int *cost_list, FULLPEL_MV *best_mv,
                          FULLPEL_MV_STATS *best_mv_stats) {
  static const int search_steps[MAX_MVSEARCH_STEPS] = {
    10, 9, 8, 7, 6, 5, 4, 3, 2, 1, 0,
  };
  int i, s, t;

  const struct buf_2d *const src = ms_params->ms_buffers.src;
  const struct buf_2d *const ref = ms_params->ms_buffers.ref;
  const search_site_config *search_sites = ms_params->search_sites;
  const int *num_candidates = search_sites->searches_per_step;
  const int ref_stride = ref->stride;
  const int last_is_4 = num_candidates[0] == 4;
  int br, bc;
  unsigned int bestsad = UINT_MAX, raw_bestsad = UINT_MAX;
  int k = -1;
  const MV_COST_PARAMS *mv_cost_params = &ms_params->mv_cost_params;
  search_step = AOMMIN(search_step, MAX_MVSEARCH_STEPS - 1);
  assert(search_step >= 0);
  int best_init_s = search_steps[search_step];
  // adjust ref_mv to make sure it is within MV range
  clamp_fullmv(&start_mv, &ms_params->mv_limits);
  br = start_mv.row;
  bc = start_mv.col;
  if (cost_list != NULL) {
    cost_list[0] = cost_list[1] = cost_list[2] = cost_list[3] = cost_list[4] =
        INT_MAX;
  }
  int costlist_has_sad = 0;

  // Work out the start point for the search
  raw_bestsad = get_mvpred_sad(ms_params, src,
                               get_buf_from_fullmv(ref, &start_mv), ref_stride);
  bestsad = raw_bestsad + mvsad_err_cost_(&start_mv, mv_cost_params);

  // Search all possible scales up to the search param around the center point
  // pick the scale of the point that is best as the starting scale of
  // further steps around it.
  const uint8_t *center_address = get_buf_from_fullmv(ref, &start_mv);
  if (do_init_search) {
    s = best_init_s;
    best_init_s = -1;
    for (t = 0; t <= s; ++t) {
      int best_site = -1;
      FULLPEL_MV center_mv = { br, bc };
      if (check_bounds(&ms_params->mv_limits, br, bc, 1 << t)) {
        // Call 4-point sad for multiples of 4 candidates.
        const int no_of_4_cand_loops = num_candidates[t] >> 2;
        for (i = 0; i < no_of_4_cand_loops; i++) {
          calc_sad4_update_bestmv(ms_params, mv_cost_params, best_mv, center_mv,
                                  center_address, &bestsad, &raw_bestsad, t,
                                  &best_site, i * 4, /*cost_list=*/NULL);
        }
        // Rest of the candidates
        const int remaining_cand = num_candidates[t] % 4;
        calc_sad_update_bestmv(ms_params, mv_cost_params, best_mv, center_mv,
                               center_address, &bestsad, &raw_bestsad, t,
                               &best_site, remaining_cand,
                               no_of_4_cand_loops * 4, NULL);
      } else {
        calc_sad_update_bestmv(ms_params, mv_cost_params, best_mv, center_mv,
                               center_address, &bestsad, &raw_bestsad, t,
                               &best_site, num_candidates[t], 0, NULL);
      }
      if (best_site == -1) {
        continue;
      } else {
        best_init_s = t;
        k = best_site;
      }
    }
    if (best_init_s != -1) {
      br += search_sites->site[best_init_s][k].mv.row;
      bc += search_sites->site[best_init_s][k].mv.col;
      center_address += search_sites->site[best_init_s][k].offset;
    }
  }

  // If the center point is still the best, just skip this and move to
  // the refinement step.
  if (best_init_s != -1) {
    const int last_s = (last_is_4 && cost_list != NULL);
    int best_site = -1;
    s = best_init_s;

    for (; s >= last_s; s--) {
      // No need to search all points the 1st time if initial search was used
      if (!do_init_search || s != best_init_s) {
        FULLPEL_MV center_mv = { br, bc };
        if (check_bounds(&ms_params->mv_limits, br, bc, 1 << s)) {
          // Call 4-point sad for multiples of 4 candidates.
          const int no_of_4_cand_loops = num_candidates[s] >> 2;
          for (i = 0; i < no_of_4_cand_loops; i++) {
            calc_sad4_update_bestmv(ms_params, mv_cost_params, best_mv,
                                    center_mv, center_address, &bestsad,
                                    &raw_bestsad, s, &best_site, i * 4,
                                    /*cost_list=*/NULL);
          }
          // Rest of the candidates
          const int remaining_cand = num_candidates[s] % 4;
          calc_sad_update_bestmv(ms_params, mv_cost_params, best_mv, center_mv,
                                 center_address, &bestsad, &raw_bestsad, s,
                                 &best_site, remaining_cand,
                                 no_of_4_cand_loops * 4, NULL);
        } else {
          calc_sad_update_bestmv(ms_params, mv_cost_params, best_mv, center_mv,
                                 center_address, &bestsad, &raw_bestsad, s,
                                 &best_site, num_candidates[s], 0, NULL);
        }

        if (best_site == -1) {
          continue;
        } else {
          br += search_sites->site[s][best_site].mv.row;
          bc += search_sites->site[s][best_site].mv.col;
          center_address += search_sites->site[s][best_site].offset;
          k = best_site;
        }
      }

      do {
        int next_chkpts_indices[PATTERN_CANDIDATES_REF];
        best_site = -1;
        next_chkpts_indices[0] = (k == 0) ? num_candidates[s] - 1 : k - 1;
        next_chkpts_indices[1] = k;
        next_chkpts_indices[2] = (k == num_candidates[s] - 1) ? 0 : k + 1;

        FULLPEL_MV center_mv = { br, bc };
        if (check_bounds(&ms_params->mv_limits, br, bc, 1 << s)) {
          calc_sad3_update_bestmv(ms_params, mv_cost_params, best_mv, center_mv,
                                  center_address, &bestsad, &raw_bestsad, s,
                                  &best_site, next_chkpts_indices, NULL);
        } else {
          calc_sad_update_bestmv_with_indices(
              ms_params, mv_cost_params, best_mv, center_mv, center_address,
              &bestsad, &raw_bestsad, s, &best_site, PATTERN_CANDIDATES_REF,
              next_chkpts_indices, NULL);
        }

        if (best_site != -1) {
          k = next_chkpts_indices[best_site];
          br += search_sites->site[s][k].mv.row;
          bc += search_sites->site[s][k].mv.col;
          center_address += search_sites->site[s][k].offset;
        }
      } while (best_site != -1);
    }
    // Note: If we enter the if below, then cost_list must be non-NULL.
    if (s == 0) {
      cost_list[0] = raw_bestsad;
      costlist_has_sad = 1;
      assert(num_candidates[s] == 4);
      if (!do_init_search || s != best_init_s) {
        FULLPEL_MV center_mv = { br, bc };
        if (check_bounds(&ms_params->mv_limits, br, bc, 1 << s)) {
          calc_sad4_update_bestmv(ms_params, mv_cost_params, best_mv, center_mv,
                                  center_address, &bestsad, &raw_bestsad, s,
                                  &best_site, 0, cost_list);
        } else {
          calc_sad_update_bestmv(ms_params, mv_cost_params, best_mv, center_mv,
                                 center_address, &bestsad, &raw_bestsad, s,
                                 &best_site, /*num_candidates=*/4,
                                 /*cand_start=*/0, cost_list);
        }

        if (best_site != -1) {
          br += search_sites->site[s][best_site].mv.row;
          bc += search_sites->site[s][best_site].mv.col;
          center_address += search_sites->site[s][best_site].offset;
          k = best_site;
        }
      }
      while (best_site != -1) {
        int next_chkpts_indices[PATTERN_CANDIDATES_REF];
        best_site = -1;
        next_chkpts_indices[0] = (k == 0) ? num_candidates[s] - 1 : k - 1;
        next_chkpts_indices[1] = k;
        next_chkpts_indices[2] = (k == num_candidates[s] - 1) ? 0 : k + 1;
        cost_list[1] = cost_list[2] = cost_list[3] = cost_list[4] = INT_MAX;
        cost_list[((k + 2) % 4) + 1] = cost_list[0];
        cost_list[0] = raw_bestsad;

        FULLPEL_MV center_mv = { br, bc };
        if (check_bounds(&ms_params->mv_limits, br, bc, 1 << s)) {
          assert(PATTERN_CANDIDATES_REF == 3);
          calc_sad3_update_bestmv(ms_params, mv_cost_params, best_mv, center_mv,
                                  center_address, &bestsad, &raw_bestsad, s,
                                  &best_site, next_chkpts_indices, cost_list);
        } else {
          calc_sad_update_bestmv_with_indices(
              ms_params, mv_cost_params, best_mv, center_mv, center_address,
              &bestsad, &raw_bestsad, s, &best_site, PATTERN_CANDIDATES_REF,
              next_chkpts_indices, cost_list);
        }

        if (best_site != -1) {
          k = next_chkpts_indices[best_site];
          br += search_sites->site[s][k].mv.row;
          bc += search_sites->site[s][k].mv.col;
          center_address += search_sites->site[s][k].offset;
        }
      }
    }
  }
  best_mv->row = br;
  best_mv->col = bc;

  assert(center_address == get_buf_from_fullmv(ref, best_mv) &&
         "center address is out of sync with best_mv!\n");

  // Returns the one-away integer pel cost/sad around the best as follows:
  // cost_list[0]: cost/sad at the best integer pel
  // cost_list[1]: cost/sad at delta {0, -1} (left)   from the best integer pel
  // cost_list[2]: cost/sad at delta { 1, 0} (bottom) from the best integer pel
  // cost_list[3]: cost/sad at delta { 0, 1} (right)  from the best integer pel
  // cost_list[4]: cost/sad at delta {-1, 0} (top)    from the best integer pel
  if (cost_list) {
    if (USE_SAD_COSTLIST) {
      calc_int_sad_list(*best_mv, ms_params, cost_list, costlist_has_sad);
    } else {
      calc_int_cost_list(*best_mv, ms_params, cost_list);
    }
  }

  const int var_cost = get_mvpred_var_cost(ms_params, best_mv, best_mv_stats);
  return var_cost;
}